

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O3

int qt_gl_resolve_extensions(void)

{
  int *piVar1;
  int iVar2;
  QOpenGLContext *this;
  Node<QByteArray,_QHashDummyValue> *pNVar3;
  pair<int,_int> pVar4;
  QOpenGLFunctions *pQVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  GLboolean srgbCapableFramebuffers;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensionMatcher;
  QByteArray local_70;
  QByteArray local_58;
  undefined1 local_40 [8];
  QHash<QByteArray,_QHashDummyValue> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher((QOpenGLExtensionMatcher *)&local_38);
  this = QOpenGLContext::currentContext();
  local_40 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format((QOpenGLContext *)local_40);
  QByteArray::QByteArray(&local_58,"GL_EXT_bgra",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    uVar6 = 0;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    uVar6 = (uint)(pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0) << 0xb;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  QByteArray::QByteArray(&local_58,"GL_ARB_texture_rectangle",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    uVar7 = 0;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    uVar7 = (uint)(pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0);
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  QByteArray::QByteArray(&local_58,"GL_ARB_texture_compression",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar8 = uVar7 | uVar6 | 4;
  if (!bVar9) {
    uVar8 = uVar7 | uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_EXT_texture_compression_s3tc",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar8 + 0x1000;
  if (!bVar9) {
    uVar6 = uVar8;
  }
  QByteArray::QByteArray(&local_58,"GL_OES_compressed_ETC1_RGB8_texture",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 + 0x2000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_IMG_texture_compression_pvrtc",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 + 0x4000;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_KHR_texture_compression_astc_ldr",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 + 0x4000000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_ARB_texture_mirrored_repeat",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 | 8;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_EXT_stencil_two_side",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 | 0x20;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_EXT_stencil_wrap",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 | 0x40;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_NV_float_buffer",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 | 0x100;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_ARB_pixel_buffer_object",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 | 0x200;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_ARB_texture_swizzle",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
LAB_0055cf53:
    QByteArray::QByteArray(&local_70,"GL_EXT_texture_swizzle",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_70);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = true;
    if (pNVar3 == (Node<QByteArray,_QHashDummyValue> *)0x0) goto LAB_0055cf53;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 | 0x1000000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_OES_standard_derivatives",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 | 0x2000000;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_ARB_half_float_vertex",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 + 0x10000000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_OVR_multiview",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 + 0x20000000;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_OVR_multiview2",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 + 0x40000000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  bVar9 = QOpenGLContext::isOpenGLES(this);
  if (!bVar9) {
    pVar4 = QSurfaceFormat::version((QSurfaceFormat *)local_40);
    uVar6 = uVar7 | 0x848000;
    if (0 < pVar4.first) {
      if (pVar4.first == 1) {
        if (1 < pVar4.second) {
          uVar6 = uVar7 | 0x848800;
        }
      }
      else {
        uVar6 = uVar7 | 0x848800;
      }
    }
    pVar4 = QSurfaceFormat::version((QSurfaceFormat *)local_40);
    if ((pVar4.first < 1) || (pVar4.second < 4 && pVar4.first == 1)) {
      QByteArray::QByteArray(&local_58,"GL_SGIS_generate_mipmap",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      uVar7 = uVar6 | 2;
      if (!bVar9) {
        uVar7 = uVar6;
      }
    }
    else {
      uVar7 = uVar6 | 2;
    }
    iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_40);
    uVar6 = uVar7 | 0x2000000;
    if (iVar2 < 2) {
      uVar6 = uVar7;
    }
    iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_40);
    if (iVar2 < 3) {
      QByteArray::QByteArray(&local_58,"GL_ARB_framebuffer_object",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      if (bVar9) goto LAB_0055d3cf;
      QByteArray::QByteArray(&local_58,"GL_EXT_framebuffer_multisample",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      uVar7 = uVar6 | 0x10;
      if (!bVar9) {
        uVar7 = uVar6;
      }
      QByteArray::QByteArray(&local_58,"GL_EXT_framebuffer_blit",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      uVar8 = uVar7 | 0x400;
      if (!bVar9) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_58,"GL_EXT_packed_depth_stencil",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      uVar6 = uVar8 | 0x80;
      if (!bVar9) {
        uVar6 = uVar8;
      }
    }
    else {
LAB_0055d3cf:
      uVar6 = uVar6 | 0x200490;
    }
    pVar4 = QSurfaceFormat::version((QSurfaceFormat *)local_40);
    if ((pVar4.first < 3) || (pVar4.second < 2 && pVar4.first == 3)) {
      QByteArray::QByteArray(&local_58,"GL_ARB_geometry_shader4",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      uVar7 = uVar6 | 0x80000;
      if (!bVar9) {
        uVar7 = uVar6;
      }
    }
    else {
      uVar7 = uVar6 | 0x80000;
    }
    pVar4 = QSurfaceFormat::version((QSurfaceFormat *)local_40);
    if (2 < pVar4.first) {
      if (pVar4.first == 3) {
        if (2 < pVar4.second) {
          uVar7 = uVar7 | 0x1000000;
        }
      }
      else {
        uVar7 = uVar7 | 0x1000000;
      }
    }
    pVar4 = QSurfaceFormat::version((QSurfaceFormat *)local_40);
    if ((pVar4.first < 4) || (pVar4.second < 3 && pVar4.first == 4)) {
      QByteArray::QByteArray(&local_58,"GL_ARB_invalidate_subdata",-1);
      if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_38.d,&local_58);
        bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
        }
      }
      uVar6 = uVar7 | 0x400000;
      if (!bVar9) {
        uVar6 = uVar7;
      }
    }
    else {
      uVar6 = uVar7 | 0x400000;
    }
    QByteArray::QByteArray(&local_58,"GL_ARB_map_buffer_range",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar7 = uVar6 | 0x100000;
    if (!bVar9) {
      uVar7 = uVar6;
    }
    QByteArray::QByteArray(&local_58,"GL_EXT_framebuffer_sRGB",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    if (bVar9) {
      local_58.d.d._0_1_ = '\0';
      pQVar5 = QOpenGLContext::functions(this);
      (*(pQVar5->d_ptr->field_0).functions[0x16])(0x8dba,&local_58);
      if ((char)local_58.d.d != '\0') {
        uVar7 = uVar7 | 0x20000;
      }
    }
    QByteArray::QByteArray(&local_58,"GL_ARB_ES3_compatibility",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar6 = uVar7 | 0x8000000;
    if (!bVar9) {
      uVar6 = uVar7;
    }
    goto LAB_0055dcfd;
  }
  iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_40);
  uVar6 = uVar7 | 2;
  if (iVar2 < 2) {
    uVar6 = uVar7;
  }
  iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_40);
  if (iVar2 < 3) {
    QByteArray::QByteArray(&local_58,"GL_OES_packed_depth_stencil",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar7 = uVar6 | 0x80;
    if (!bVar9) {
      uVar7 = uVar6;
    }
    QByteArray::QByteArray(&local_58,"GL_OES_depth24",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar6 = uVar7 | 0x10000;
    if (!bVar9) {
      uVar6 = uVar7;
    }
    QByteArray::QByteArray(&local_58,"GL_ANGLE_framebuffer_blit",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar7 = uVar6 | 0x400;
    if (!bVar9) {
      uVar7 = uVar6;
    }
    QByteArray::QByteArray(&local_58,"GL_ANGLE_framebuffer_multisample",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar6 = uVar7 | 0x10;
    if (!bVar9) {
      uVar6 = uVar7;
    }
    QByteArray::QByteArray(&local_58,"GL_NV_framebuffer_blit",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar7 = uVar6 | 0x400;
    if (!bVar9) {
      uVar7 = uVar6;
    }
    QByteArray::QByteArray(&local_58,"GL_NV_framebuffer_multisample",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar6 = uVar7 | 0x10;
    if (!bVar9) {
      uVar6 = uVar7;
    }
    QByteArray::QByteArray(&local_58,"GL_OES_rgb8_rgba8",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar7 = uVar6 | 0x200000;
    if (!bVar9) {
      uVar7 = uVar6;
    }
    QByteArray::QByteArray(&local_58,"GL_OES_compressed_ETC2_RGB8_texture",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_58);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10)
        ;
      }
    }
    uVar6 = uVar7 | 0x8000000;
    if (!bVar9) {
      uVar6 = uVar7;
    }
  }
  else {
    uVar6 = uVar6 | 0x1b718490;
  }
  QByteArray::QByteArray(&local_58,"GL_OES_mapbuffer",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 | 0x40000;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_OES_element_index_uint",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar7 | 0x8000;
  if (!bVar9) {
    uVar6 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_IMG_texture_format_BGRA8888",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
LAB_0055d7c1:
    QByteArray::QByteArray(&local_70,"GL_EXT_texture_format_BGRA8888",-1);
    if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_38.d,&local_70);
      bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = true;
    if (pNVar3 == (Node<QByteArray,_QHashDummyValue> *)0x0) goto LAB_0055d7c1;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar7 = uVar6 | 0x800;
  if (!bVar9) {
    uVar7 = uVar6;
  }
  QByteArray::QByteArray(&local_58,"GL_EXT_discard_framebuffer",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar8 = uVar7 | 0x400000;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_58,"GL_EXT_texture_norm16",-1);
  if (local_38.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_38.d,&local_58);
    bVar9 = pNVar3 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  piVar1 = (int *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_58.d.d._1_7_,(char)local_58.d.d),1,0x10);
    }
  }
  uVar6 = uVar8 | 0x800000;
  if (!bVar9) {
    uVar6 = uVar8;
  }
LAB_0055dcfd:
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_40);
  QHash<QByteArray,_QHashDummyValue>::~QHash(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

static int qt_gl_resolve_extensions()
{
    int extensions = 0;
    QOpenGLExtensionMatcher extensionMatcher;
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QSurfaceFormat format = ctx->format();

    if (extensionMatcher.match("GL_EXT_bgra"))
        extensions |= QOpenGLExtensions::BGRATextureFormat;
    if (extensionMatcher.match("GL_ARB_texture_rectangle"))
        extensions |= QOpenGLExtensions::TextureRectangle;
    if (extensionMatcher.match("GL_ARB_texture_compression"))
        extensions |= QOpenGLExtensions::TextureCompression;
    if (extensionMatcher.match("GL_EXT_texture_compression_s3tc"))
        extensions |= QOpenGLExtensions::DDSTextureCompression;
    if (extensionMatcher.match("GL_OES_compressed_ETC1_RGB8_texture"))
        extensions |= QOpenGLExtensions::ETC1TextureCompression;
    if (extensionMatcher.match("GL_IMG_texture_compression_pvrtc"))
        extensions |= QOpenGLExtensions::PVRTCTextureCompression;
    if (extensionMatcher.match("GL_KHR_texture_compression_astc_ldr"))
        extensions |= QOpenGLExtensions::ASTCTextureCompression;
    if (extensionMatcher.match("GL_ARB_texture_mirrored_repeat"))
        extensions |= QOpenGLExtensions::MirroredRepeat;
    if (extensionMatcher.match("GL_EXT_stencil_two_side"))
        extensions |= QOpenGLExtensions::StencilTwoSide;
    if (extensionMatcher.match("GL_EXT_stencil_wrap"))
        extensions |= QOpenGLExtensions::StencilWrap;
    if (extensionMatcher.match("GL_NV_float_buffer"))
        extensions |= QOpenGLExtensions::NVFloatBuffer;
    if (extensionMatcher.match("GL_ARB_pixel_buffer_object"))
        extensions |= QOpenGLExtensions::PixelBufferObject;
    if (extensionMatcher.match("GL_ARB_texture_swizzle") || extensionMatcher.match("GL_EXT_texture_swizzle"))
        extensions |= QOpenGLExtensions::TextureSwizzle;
    if (extensionMatcher.match("GL_OES_standard_derivatives"))
        extensions |= QOpenGLExtensions::StandardDerivatives;
    if (extensionMatcher.match("GL_ARB_half_float_vertex"))
        extensions |= QOpenGLExtensions::HalfFloatVertex;
    if (extensionMatcher.match("GL_OVR_multiview"))
        extensions |= QOpenGLExtensions::MultiView;
    if (extensionMatcher.match("GL_OVR_multiview2"))
        extensions |= QOpenGLExtensions::MultiViewExtended;

    if (ctx->isOpenGLES()) {
        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 3) {
            extensions |= QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Depth24
                | QOpenGLExtensions::ElementIndexUint
                | QOpenGLExtensions::MapBufferRange
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::Sized8Formats
                | QOpenGLExtensions::DiscardFramebuffer
                | QOpenGLExtensions::StandardDerivatives
                | QOpenGLExtensions::ETC2TextureCompression
                | QOpenGLExtensions::HalfFloatVertex;
#ifndef Q_OS_WASM
            // WebGL 2.0 specification explicitly does not support texture swizzles
            // https://registry.khronos.org/webgl/specs/latest/2.0/#5.19
            extensions |= QOpenGLExtensions::TextureSwizzle;
#endif
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_OES_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
            if (extensionMatcher.match("GL_OES_depth24"))
                extensions |= QOpenGLExtensions::Depth24;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_NV_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_NV_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_OES_rgb8_rgba8"))
                extensions |= QOpenGLExtensions::Sized8Formats;
            if (extensionMatcher.match("GL_OES_compressed_ETC2_RGB8_texture"))
                extensions |= QOpenGLExtensions::ETC2TextureCompression;
        }

        if (extensionMatcher.match("GL_OES_mapbuffer"))
            extensions |= QOpenGLExtensions::MapBuffer;
        if (extensionMatcher.match("GL_OES_element_index_uint"))
            extensions |= QOpenGLExtensions::ElementIndexUint;
        // We don't match GL_APPLE_texture_format_BGRA8888 here because it has different semantics.
        if (extensionMatcher.match("GL_IMG_texture_format_BGRA8888") || extensionMatcher.match("GL_EXT_texture_format_BGRA8888"))
            extensions |= QOpenGLExtensions::BGRATextureFormat;
#ifdef Q_OS_ANDROID
        QString *deviceName =
                static_cast<QString *>(QGuiApplication::platformNativeInterface()->nativeResourceForIntegration("AndroidDeviceName"));
        static bool wrongfullyReportsBgra8888Support = deviceName != 0
                                                        && (deviceName->compare("samsung SM-T211"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T210"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T215"_L1, Qt::CaseInsensitive) == 0);
        if (wrongfullyReportsBgra8888Support)
            extensions &= ~QOpenGLExtensions::BGRATextureFormat;
#endif

        if (extensionMatcher.match("GL_EXT_discard_framebuffer"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;
        if (extensionMatcher.match("GL_EXT_texture_norm16"))
            extensions |= QOpenGLExtensions::Sized16Formats;
    } else {
        extensions |= QOpenGLExtensions::ElementIndexUint
            | QOpenGLExtensions::MapBuffer
            | QOpenGLExtensions::Sized16Formats;

        if (format.version() >= std::pair(1, 2))
            extensions |= QOpenGLExtensions::BGRATextureFormat;

        if (format.version() >= std::pair(1, 4) || extensionMatcher.match("GL_SGIS_generate_mipmap"))
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::StandardDerivatives;

        if (format.majorVersion() >= 3 || extensionMatcher.match("GL_ARB_framebuffer_object")) {
            extensions |= QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Sized8Formats;
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_EXT_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_EXT_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_EXT_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
        }

        if (format.version() >= std::pair(3, 2) || extensionMatcher.match("GL_ARB_geometry_shader4"))
            extensions |= QOpenGLExtensions::GeometryShaders;

        if (format.version() >= std::pair(3, 3))
            extensions |= QOpenGLExtensions::TextureSwizzle;

        if (format.version() >= std::pair(4, 3) || extensionMatcher.match("GL_ARB_invalidate_subdata"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;

        if (extensionMatcher.match("GL_ARB_map_buffer_range"))
            extensions |= QOpenGLExtensions::MapBufferRange;

        if (extensionMatcher.match("GL_EXT_framebuffer_sRGB")) {
            GLboolean srgbCapableFramebuffers = false;
            ctx->functions()->glGetBooleanv(GL_FRAMEBUFFER_SRGB_CAPABLE_EXT, &srgbCapableFramebuffers);
            if (srgbCapableFramebuffers)
                extensions |= QOpenGLExtensions::SRGBFrameBuffer;
        }

        if (extensionMatcher.match("GL_ARB_ES3_compatibility"))
            extensions |= QOpenGLExtensions::ETC2TextureCompression;
    }

    return extensions;
}